

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::BitwiseAnd(Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
                     uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
                     uint32_t width,uint32_t height,SIMDType simdType)

{
  uchar *puVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  long lVar11;
  byte bVar12;
  SIMDType SVar13;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  byte *pbVar14;
  uchar *puVar15;
  byte *pbVar16;
  undefined4 in_register_0000008c;
  uint uVar17;
  uint uVar18;
  uchar *puVar19;
  uchar *puVar20;
  long lVar21;
  byte *pbVar22;
  uint local_cc;
  uint32_t local_b0;
  uint local_ac;
  undefined8 local_a8;
  undefined8 local_a0;
  ulong local_98;
  ulong local_90;
  Image *local_88;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  local_a0 = CONCAT44(in_register_0000008c,startY2);
  local_a8 = CONCAT44(in_register_00000014,startY1);
  local_98 = (ulong)height;
  local_90 = (ulong)startYOut;
  do {
    SVar13 = simdType;
    bVar12 = Image_Function::CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>
                       (in1,in2,out);
    local_b0 = (uint32_t)local_98;
    if (SVar13 != avx_function) {
      if (SVar13 - sse_function < 2) {
        local_cc = 0x10;
        if (0xf < bVar12 * width) goto LAB_00123cfb;
      }
      else if (SVar13 != cpu_function) {
        local_cc = 0;
        goto LAB_00123cfb;
      }
      Image_Function::BitwiseAnd
                (in1,startX1,(uint32_t)local_a8,in2,startX2,(uint32_t)local_a0,out,startXOut,
                 startYOut,width,height);
      return;
    }
    simdType = sse_function;
  } while (bVar12 * width < 0x20);
  local_cc = 0x20;
LAB_00123cfb:
  uVar17 = (uint)bVar12;
  local_88 = in1;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,(uint32_t)local_a8,in2,startX2,(uint32_t)local_a0,out,startXOut,
             (uint32_t)local_90,width,local_b0);
  local_ac = width * uVar17;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = in2->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)in2,src);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_ac,&local_b0,local_88,&local_58,&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar4 = in1->_rowSize;
  uVar5 = in2->_rowSize;
  uVar6 = out->_rowSize;
  uVar18 = local_b0 * uVar6;
  puVar20 = in1->_data + (ulong)(startX1 * uVar17) + (ulong)((int)local_a8 * uVar4);
  uVar7 = (ulong)local_ac / (ulong)local_cc;
  uVar8 = (ulong)local_ac % (ulong)local_cc;
  puVar19 = out->_data + (ulong)(startXOut * uVar17) + (ulong)((int)local_90 * uVar6);
  puVar15 = in2->_data + (ulong)(startX2 * uVar17) + (ulong)((int)local_a0 * uVar5);
  puVar1 = puVar19 + uVar18;
  uVar17 = (int)uVar7 * local_cc;
  if (SVar13 == sse_function) {
    if (uVar18 != 0) {
      do {
        if (local_cc <= local_ac) {
          lVar21 = 0;
          do {
            lVar11 = lVar21 + 0x10;
            auVar9 = vandps_avx(*(undefined1 (*) [16])(puVar15 + lVar21),
                                *(undefined1 (*) [16])(puVar20 + lVar11 + -0x10));
            *(undefined1 (*) [16])(puVar19 + lVar21) = auVar9;
            lVar21 = lVar21 + 0x10;
          } while (puVar20 + lVar11 != puVar20 + uVar7 * 0x10);
        }
        if (local_ac != uVar17) {
          pbVar22 = puVar19 + uVar17;
          pbVar16 = puVar15 + uVar17;
          pbVar14 = puVar20 + uVar17;
          pbVar2 = pbVar22 + uVar8;
          do {
            bVar12 = *pbVar16;
            pbVar16 = pbVar16 + 1;
            bVar3 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            *pbVar22 = bVar12 & bVar3;
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 != pbVar2);
        }
        puVar19 = puVar19 + uVar6;
        puVar20 = puVar20 + uVar4;
        puVar15 = puVar15 + uVar5;
      } while (puVar19 != puVar1);
    }
  }
  else if ((SVar13 == avx_function) && (uVar18 != 0)) {
    do {
      if (local_cc <= local_ac) {
        lVar21 = 0;
        do {
          lVar11 = lVar21 + 0x20;
          auVar10 = vandps_avx(*(undefined1 (*) [32])(puVar15 + lVar21),
                               *(undefined1 (*) [32])(puVar20 + lVar11 + -0x20));
          *(undefined1 (*) [32])(puVar19 + lVar21) = auVar10;
          lVar21 = lVar21 + 0x20;
        } while (puVar20 + lVar11 != puVar20 + uVar7 * 0x20);
      }
      if (local_ac != uVar17) {
        pbVar22 = puVar19 + uVar17;
        pbVar16 = puVar15 + uVar17;
        pbVar14 = puVar20 + uVar17;
        pbVar2 = pbVar22 + uVar8;
        do {
          bVar12 = *pbVar16;
          pbVar16 = pbVar16 + 1;
          bVar3 = *pbVar14;
          pbVar14 = pbVar14 + 1;
          *pbVar22 = bVar12 & bVar3;
          pbVar22 = pbVar22 + 1;
        } while (pbVar22 != pbVar2);
      }
      puVar19 = puVar19 + uVar6;
      puVar20 = puVar20 + uVar4;
      puVar15 = puVar15 + uVar5;
    } while (puVar19 != puVar1);
  }
  return;
}

Assistant:

void BitwiseAnd( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                     Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height, SIMDType simdType )
    {
        const uint8_t colorCount = Image_Function::CommonColorCount( in1, in2, out );
        const uint32_t simdSize = getSimdSize( simdType );

        if( (simdType == cpu_function) || (width * colorCount < simdSize) ) {
            AVX_CODE( BitwiseAnd( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::BitwiseAnd( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in1, in2, out );

        const uint32_t rowSizeIn1 = in1.rowSize();
        const uint32_t rowSizeIn2 = in2.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * in1Y = in1.data() + startY1   * rowSizeIn1 + startX1   * colorCount;
        const uint8_t * in2Y = in2.data() + startY2   * rowSizeIn2 + startX2   * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t simdWidth = width / simdSize;
        const uint32_t totalSimdWidth = simdWidth * simdSize;
        const uint32_t nonSimdWidth = width - totalSimdWidth;

        AVX_CODE( avx::BitwiseAnd( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        SSE_CODE( sse::BitwiseAnd( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::BitwiseAnd( rowSizeIn1, rowSizeIn2, rowSizeOut, in1Y, in2Y, outY, outYEnd, simdWidth, totalSimdWidth, nonSimdWidth ); )
    }